

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex2D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  __GMM_BUFFER_TYPE *pBufferType;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  GMM_STATUS GVar10;
  uint32_t uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  uint32_t local_7c;
  GMM_PLATFORM_INFO *pGStack_78;
  uint32_t CompressDepth;
  uint local_6c;
  uint local_68;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint32_t local_3c;
  uint32_t local_38;
  uint8_t local_31;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGStack_78 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  local_58 = (uint)pTexInfo->BaseWidth;
  uVar11 = (pTexInfo->MSAA).NumSamples;
  (pTexInfo->MSAA).NumSamples = uVar11 + (uVar11 == 0);
  auVar13._0_8_ = -(ulong)(((ulong)(pTexInfo->Flags).Gpu & 0x20000000002) == 0x20000000002);
  auVar13._8_8_ = -(ulong)(((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0);
  uVar5 = movmskpd((int)pGStack_78,auVar13);
  local_3c = 8;
  if ((uVar5 & 1) == 0) {
    local_3c = pTexInfo->BitsPerPixel;
  }
  if ((uVar5 & 2) == 0) {
    GmmTextureCalc::FindMipTailStartLod(&this->super_GmmTextureCalc,pTexInfo);
  }
  uVar5 = pTexInfo->ArraySize;
  uVar7 = 1;
  uVar11 = 1;
  if (pTexInfo->Type == RESOURCE_3D) {
    uVar11 = pTexInfo->Depth;
  }
  aVar3 = (pTexInfo->Flags).Gpu;
  if ((((ulong)aVar3 & 0x20000040) == 0) && (((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0)) {
    uVar7 = (pTexInfo->MSAA).NumSamples;
  }
  uVar6 = ((uint)(pTexInfo->Type == RESOURCE_CUBE) * 5 + 1) * (uVar5 + (uVar5 == 0)) * uVar11 *
          uVar7;
  if ((((ulong)(pTexInfo->Flags).Info & 0x6000000000) != 0) &&
     (uVar12 = pGStack_78->TileInfo[pTexInfo->TileMode].LogicalTileDepth, uVar12 != 0)) {
    uVar6 = ((uVar6 - 1) + uVar12) / uVar12;
  }
  uVar12 = uVar6;
  if ((((ulong)aVar3 & 0x18) != 0) &&
     (((uVar6 != uVar5 || 2 < uVar6 ||
       ((3 < pTexInfo->Format - GMM_FORMAT_B8G8R8A8_UNORM &&
        (1 < pTexInfo->Format - GMM_FORMAT_R8G8B8A8_UNORM)))) ||
      ((uVar12 = 4, ((byte)(((ulong)aVar3 & 0xffffffff) >> 3) & 0x1f & (local_58 & 0xf) == 0) == 0
       && ((((ulong)aVar3 & 0x10) == 0 || (local_58 % 0xc != 0)))))))) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xffffffffffffffe7);
    uVar12 = uVar6;
  }
  local_38 = (pTexInfo->Alignment).HAlign;
  uVar11 = (pTexInfo->Alignment).VAlign;
  _CompressWidth = pRestrictions;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_68,&local_6c,&local_7c);
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  if (uVar12 < 2) {
    (pTexInfo->Alignment).QPitch = 0;
    CompressHeight = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[6])(this,pTexInfo);
    uVar5 = local_58;
  }
  else {
    if (((((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) ||
         ((((pTexInfo->Flags).Gpu.field_0x3 & 2) != 0 &&
          (((uint)(((this->super_GmmTextureCalc).pGmmLibContext)->SkuTable).field_5 & 2) != 0)))) ||
        (((pTexInfo->Flags).Wa.field_0x1 & 8) != 0)) &&
       (uVar11 = pGStack_78->TileInfo[pTexInfo->TileMode].LogicalTileHeight,
       ((pTexInfo->Flags).Gpu.field_0x3 & 0x20) != 0)) {
      uVar11 = uVar11 << ((byte)((ulong)(pTexInfo->Flags).Info >> 0x22) & 1);
    }
    uVar7 = Get2DMipMapTotalHeight(this,pTexInfo);
    uVar5 = local_58;
    if (uVar11 != 0) {
      uVar6 = (uVar11 - 1) + uVar7;
      uVar7 = uVar6 - uVar6 % uVar11;
    }
    (pTexInfo->Alignment).QPitch = uVar7;
    if (local_31 == '\0') {
      aVar3 = (pTexInfo->Flags).Gpu;
      if (((aVar3._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
        uVar6 = uVar7 >> 4;
        if ((~(ulong)aVar3 & 0x20000000002) != 0) {
          uVar6 = uVar7;
        }
      }
      else {
        uVar6 = uVar7 >> 1;
      }
    }
    else {
      if (local_6c != 0) {
        uVar7 = ((uVar7 - 1) + local_6c) / local_6c;
      }
      uVar6 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0xb])
                        (this,pTexInfo,(ulong)uVar7,(ulong)uVar12);
    }
    CompressHeight = uVar6 * uVar12;
  }
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar11 = 1;
  }
  else {
    uVar11 = (pTexInfo->MSAA).NumSamples;
  }
  uVar11 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,uVar5,local_38,uVar11);
  uVar6 = uVar11;
  if (((((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0) ||
      (1 < (pTexInfo->Alignment).MipTailStartLod)) && (1 < pTexInfo->MaxLod)) {
    uVar8 = 1;
    uVar7 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar7 = (pTexInfo->MSAA).NumSamples;
    }
    uVar7 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,uVar5 >> 1,local_38,uVar7);
    local_58 = local_58 >> 2;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar8 = (pTexInfo->MSAA).NumSamples;
    }
    uVar8 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,local_58,local_38,uVar8);
    uVar6 = uVar8 + uVar7;
    if (uVar8 + uVar7 < uVar11) {
      uVar6 = uVar11;
    }
  }
  pBufferType = _CompressWidth;
  if (local_31 == '\0') {
    aVar3 = (pTexInfo->Flags).Gpu;
    if (((aVar3._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
      if ((~(ulong)aVar3 & 0x20000000002) == 0) {
        uVar11 = pTexInfo->BitsPerPixel;
        if (uVar11 == 0x80) {
          uVar6 = uVar6 >> 1;
          goto LAB_001b30ad;
        }
        if (uVar11 != 0x40) {
          if (uVar11 == 0x20) {
            uVar6 = uVar6 >> 3;
          }
          goto LAB_001b30ad;
        }
      }
      else {
        if (((ulong)aVar3 & 8) == 0) {
          if (((ulong)aVar3 & 0x10) != 0) {
            uVar6 = (uVar6 * pTexInfo->ArraySize) / 3;
          }
          goto LAB_001b30ad;
        }
        uVar6 = uVar6 * pTexInfo->ArraySize;
      }
      uVar6 = uVar6 >> 2;
    }
    else {
      uVar6 = uVar6 * 2;
    }
  }
  else if (local_68 != 0) {
    uVar6 = ((uVar6 - 1) + local_68) / local_68;
  }
LAB_001b30ad:
  uVar5 = uVar6 * local_3c >> 3;
  if (uVar5 <= _CompressWidth->MinPitch) {
    uVar5 = _CompressWidth->MinPitch;
  }
  local_58 = -_CompressWidth->PitchAlignment & (_CompressWidth->PitchAlignment - 1) + uVar5;
  uStack_54 = CompressHeight;
  if (pGStack_78->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    uVar1 = pGStack_78->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar2 = pGStack_78->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    local_58 = local_58 + uVar1 + -1 & -uVar1;
    uStack_54 = CompressHeight + uVar2 + -1 & -uVar2;
  }
  uStack_50 = 0;
  uStack_4c = 0;
  (pTexInfo->Flags).Info =
       (anon_struct_8_44_94931171_for_Info)
       ((ulong)(pTexInfo->Flags).Info & 0xfffffffffffd7fff | 0x8000);
  uVar4 = GmmIsYUVPacked(pTexInfo->Format);
  if (((uVar4 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
     (uVar5 = uStack_54, pTexInfo->BitsPerPixel == 0x30)) {
    if (local_58 == 0) {
      iVar9 = 0x11;
    }
    else {
      iVar9 = (local_58 + 0xf) / local_58 + 1;
    }
    uVar5 = uStack_54 + iVar9;
  }
  GVar10 = GmmTextureCalc::FillTexPitchAndSize
                     (&this->super_GmmTextureCalc,pTexInfo,(ulong)local_58,uVar5 + 1 & 0xfffffffe,
                      pBufferType);
  if (GVar10 == GMM_SUCCESS) {
    (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[7])(this,pTexInfo);
  }
  return GVar10;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign, DAlign, CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        // Aux Surfaces are 8bpp.
        BitsPerPixel = 8;
    }

    Height = pTexInfo->BaseHeight;
    Width  = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    if(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs)
    {
        FindMipTailStartLod(pTexInfo);
    }

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) *             // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Type == RESOURCE_3D) ? pTexInfo->Depth : 1) * // 3D's simply 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil ||
      (pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)) ? // MSAA Ys samples are NOT stored as array planes.
     1 :
     pTexInfo->MSAA.NumSamples); // MSAA (non-Depth/Stencil) RT samples stored as array planes.

    if(pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)
    {
        ExpandedArraySize = GFX_CEIL_DIV(ExpandedArraySize, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth);
    }

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = false;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = false;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    DAlign = pTexInfo->Alignment.DAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    if(ExpandedArraySize > 1)
    {
        uint32_t Alignment = VAlign;
        if((pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear) ||
           (pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) ||
           (pTexInfo->Flags.Wa.MediaPipeUsage))
        {
            Alignment = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
	    //Gmm uses TileY for Stencil allocations, having half TileW height (TileY width compensates)
            if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                Alignment *= 2;
            }
	}

        // Calculate the overall Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
        BlockHeight = Get2DMipMapTotalHeight(pTexInfo);
        BlockHeight = GFX_ALIGN_NP2(BlockHeight, Alignment);

        // GMM internally uses QPitch as the logical distance between slices, but translates
        // as appropriate to service client queries in GmmResGetQPitch.
        pTexInfo->Alignment.QPitch = BlockHeight;

        if(Compress)
        {
            BlockHeight = GFX_CEIL_DIV(BlockHeight, CompressHeight);

            BlockHeight = GetAligned3DBlockHeight(pTexInfo, BlockHeight, ExpandedArraySize);
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            BlockHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BlockHeight /= 16;
        }

        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        pTexInfo->Alignment.QPitch = 0;

        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }

    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths
    // are greater than LOD0. e.g. dimensions 4x4 and MinPitch == 1
    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       (pTexInfo->Alignment.MipTailStartLod < 2))
    {
        // Do nothing -- all mips are in LOD0/LOD1, which is already width aligned.
    }
    else if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth = GFX_CEIL_DIV(AlignedWidth, CompressWidth);
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        switch(pTexInfo->BitsPerPixel)
        {
            case 32:
                AlignedWidth /= 8;
                break;
            case 64:
                AlignedWidth /= 4;
                break;
            case 128:
                AlignedWidth /= 2;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);

    ////////////////////
    // Adjust for Tiling
    ////////////////////

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over-fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;

    return (Status);
}